

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_R_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Record_R_PDU::Decode(Record_R_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT32 *T;
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  uint uVar3;
  undefined1 local_58 [48];
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x27 < iVar2 + (uint)KVar1) {
    Simulation_Management_Header::Decode((Simulation_Management_Header *)this,stream,ignoreHeader);
    KDataStream::Read<unsigned_int>(stream,&(this->super_Set_Record_R_PDU).m_ui32RqId);
    KDataStream::Read(stream,&(this->super_Set_Record_R_PDU).super_Reliability_Header.m_ui8ReqRelSrv
                     );
    KDataStream::Read(stream,&(this->super_Set_Record_R_PDU).super_Simulation_Management_Header.
                              super_Header.super_Header6.m_ui8Padding2);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16EvntTyp);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32SrlNm);
    T = &(this->super_Set_Record_R_PDU).m_ui32NumRecSets;
    KDataStream::Read<unsigned_int>(stream,T);
    if ((this->super_Set_Record_R_PDU).m_ui32NumRecSets != 0) {
      uVar3 = 0;
      do {
        DATA_TYPE::RecordSet::RecordSet((RecordSet *)local_58,stream);
        std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::
        emplace_back<KDIS::DATA_TYPE::RecordSet>
                  (&(this->super_Set_Record_R_PDU).m_vRecs,(RecordSet *)local_58);
        DATA_TYPE::RecordSet::~RecordSet((RecordSet *)local_58);
        uVar3 = uVar3 + 1;
      } while (uVar3 < *T);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_58._0_8_ = local_58 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Decode","");
  KException::KException(this_00,(KString *)local_58,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Record_R_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < RECORD_R_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> m_ui32RqId
           >> m_ui8ReqRelSrv
           >> m_ui8Padding2
           >> m_ui16EvntTyp
           >> m_ui32SrlNm
           >> m_ui32NumRecSets;

    for( KUINT32 i = 0; i < m_ui32NumRecSets; ++i )
    {
        m_vRecs.push_back( RecordSet( stream ) );
    }
}